

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderPNG.cpp
# Opt level: O1

IImage * __thiscall irr::video::CImageLoaderPng::loadImage(CImageLoaderPng *this,IReadFile *file)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  __jmp_buf_tag *p_Var3;
  IImage *this_00;
  void *pvVar4;
  IImage *extraout_RAX;
  u8 *puVar5;
  ECOLOR_FORMAT format;
  long *plVar6;
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined8 uVar10;
  png_structp png_ptr;
  s32 ColorType;
  png_infop info_ptr;
  s32 BitDepth;
  png_uint_32 w;
  int intent;
  png_uint_32 h_1;
  png_byte buffer [8];
  png_structp local_60;
  uint local_54;
  long local_50;
  int local_44;
  dimension2d<unsigned_int> local_40;
  uint local_38;
  uint local_34;
  undefined1 local_30 [8];
  
  if (file != (IReadFile *)0x0) {
    iVar2 = (**file->_vptr_IReadFile)(file,local_30,8);
    if (CONCAT44(extraout_var,iVar2) == 8) {
      iVar2 = png_sig_cmp(local_30,0,8);
      if (iVar2 == 0) {
        local_60 = (png_structp)
                   png_create_read_struct("1.6.37",0,png_cpexcept_error,png_cpexcept_warn);
        if (local_60 != (png_structp)0x0) {
          local_50 = png_create_info_struct(local_60);
          if (local_50 == 0) {
            (*file->_vptr_IReadFile[4])(file);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            plVar6 = (long *)0x0;
          }
          else {
            p_Var3 = (__jmp_buf_tag *)png_set_longjmp_fn(local_60,longjmp,200);
            iVar2 = _setjmp(p_Var3);
            if (iVar2 == 0) {
              png_set_read_fn(local_60,file,user_read_data_fcn);
              png_set_sig_bytes(local_60,8);
              png_read_info(local_60,local_50);
              png_get_IHDR(local_60,local_50,&local_40,&local_38,&local_44,&local_54,0,0,0);
              if ((23000 < local_40.Width) || (23000 < local_38)) {
                png_cpexcept_error(local_60,"Unreasonable size");
                return extraout_RAX;
              }
              if (local_54 == 3) {
                png_set_palette_to_rgb(local_60);
              }
              if (local_44 < 8) {
                if ((local_54 & 0xfffffffb) == 0) {
                  png_set_expand_gray_1_2_4_to_8(local_60);
                }
                else {
                  png_set_packing();
                }
              }
              iVar2 = png_get_valid(local_60,local_50,0x10);
              if (iVar2 != 0) {
                png_set_tRNS_to_alpha(local_60);
              }
              if (local_44 == 0x10) {
                png_set_strip_16(local_60);
              }
              if ((local_54 & 0xfffffffb) == 0) {
                png_set_gray_to_rgb(local_60);
              }
              iVar2 = png_get_sRGB(local_60,local_50,&local_38);
              if (iVar2 == 0) {
                iVar2 = png_get_gAMA(local_60,local_50,&local_40);
                if (iVar2 == 0) {
                  uVar10 = 0x3fdd1758e219652c;
                }
                else {
                  uVar10 = CONCAT44(local_40.Height,local_40.Width);
                }
              }
              else {
                uVar10 = 0x3fdd1758e219652c;
              }
              png_set_gamma(0x9999999a,uVar10,local_60);
              png_read_update_info(local_60,local_50);
              png_get_IHDR(local_60,local_50,&local_40,&local_34,&local_44,&local_54,0,0,0);
              if (local_54 == 6) {
                png_set_bgr(local_60);
              }
              this_00 = (IImage *)operator_new(0x50);
              if (local_54 == 6) {
                format = ECF_A8R8G8B8;
              }
              else {
                format = ECF_R8G8B8;
              }
              CImage::CImage((CImage *)this_00,format,&local_40);
              pvVar4 = operator_new__((ulong)local_34 * 8);
              if (local_34 != 0) {
                puVar5 = this_00->Data;
                uVar1 = this_00->Pitch;
                uVar7 = 0;
                do {
                  *(u8 **)((long)pvVar4 + uVar7 * 8) = puVar5;
                  puVar5 = puVar5 + uVar1;
                  uVar7 = uVar7 + 1;
                } while (local_34 != uVar7);
              }
              p_Var3 = (__jmp_buf_tag *)png_set_longjmp_fn(local_60,longjmp,200);
              iVar2 = _setjmp(p_Var3);
              if (iVar2 != 0) {
                png_destroy_read_struct(&local_60,&local_50,0);
                operator_delete__(pvVar4);
                (*this_00->_vptr_IImage[1])(this_00);
                return (IImage *)0x0;
              }
              png_read_image(local_60,pvVar4);
              png_read_end(local_60,0);
              operator_delete__(pvVar4);
              plVar6 = &local_50;
              goto LAB_00202c38;
            }
            plVar6 = &local_50;
          }
          this_00 = (IImage *)0x0;
LAB_00202c38:
          png_destroy_read_struct(&local_60,plVar6,0);
          return this_00;
        }
        (*file->_vptr_IReadFile[4])(file);
        uVar8 = extraout_XMM0_Da_01;
        uVar9 = extraout_XMM0_Db_01;
      }
      else {
        (*file->_vptr_IReadFile[4])(file);
        uVar8 = extraout_XMM0_Da;
        uVar9 = extraout_XMM0_Db;
      }
    }
    else {
      (*file->_vptr_IReadFile[4])(file);
      uVar8 = extraout_XMM0_Da_00;
      uVar9 = extraout_XMM0_Db_00;
    }
    os::Printer::log((double)CONCAT44(uVar9,uVar8));
  }
  return (IImage *)0x0;
}

Assistant:

IImage *CImageLoaderPng::loadImage(io::IReadFile *file) const
{
	if (!file)
		return 0;

	// Used to point to image rows
	u8 **RowPointers = 0;

	png_byte buffer[8];
	// Read the first few bytes of the PNG file
	if (file->read(buffer, 8) != 8) {
		os::Printer::log("LOAD PNG: can't read file (filesize < 8)", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// Check if it really is a PNG file
	if (png_sig_cmp(buffer, 0, 8)) {
		os::Printer::log("LOAD PNG: not really a png (wrong signature)", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// Allocate the png read struct
	png_structp png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING,
			NULL, (png_error_ptr)png_cpexcept_error, (png_error_ptr)png_cpexcept_warn);
	if (!png_ptr) {
		os::Printer::log("LOAD PNG: Internal PNG create read struct failure", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// Allocate the png info struct
	png_infop info_ptr = png_create_info_struct(png_ptr);
	if (!info_ptr) {
		os::Printer::log("LOAD PNG: Internal PNG create info struct failure", file->getFileName(), ELL_ERROR);
		png_destroy_read_struct(&png_ptr, NULL, NULL);
		return 0;
	}

	// for proper error handling
	if (setjmp(png_jmpbuf(png_ptr))) {
		png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
		delete[] RowPointers;
		return 0;
	}

	// changed by zola so we don't need to have public FILE pointers
	png_set_read_fn(png_ptr, file, user_read_data_fcn);

	png_set_sig_bytes(png_ptr, 8); // Tell png that we read the signature

	png_read_info(png_ptr, info_ptr); // Read the info section of the png file

	u32 Width;
	u32 Height;
	s32 BitDepth;
	s32 ColorType;
	{
		// Use temporary variables to avoid passing cast pointers
		png_uint_32 w, h;
		// Extract info
		png_get_IHDR(png_ptr, info_ptr,
				&w, &h,
				&BitDepth, &ColorType, NULL, NULL, NULL);
		Width = w;
		Height = h;
	}

	if (!checkImageDimensions(Width, Height))
		png_cpexcept_error(png_ptr, "Unreasonable size");

	// Convert palette color to true color
	if (ColorType == PNG_COLOR_TYPE_PALETTE)
		png_set_palette_to_rgb(png_ptr);

	// Convert low bit colors to 8 bit colors
	if (BitDepth < 8) {
		if (ColorType == PNG_COLOR_TYPE_GRAY || ColorType == PNG_COLOR_TYPE_GRAY_ALPHA)
			png_set_expand_gray_1_2_4_to_8(png_ptr);
		else
			png_set_packing(png_ptr);
	}

	if (png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS))
		png_set_tRNS_to_alpha(png_ptr);

	// Convert high bit colors to 8 bit colors
	if (BitDepth == 16)
		png_set_strip_16(png_ptr);

	// Convert gray color to true color
	if (ColorType == PNG_COLOR_TYPE_GRAY || ColorType == PNG_COLOR_TYPE_GRAY_ALPHA)
		png_set_gray_to_rgb(png_ptr);

	int intent;
	const double screen_gamma = 2.2;

	if (png_get_sRGB(png_ptr, info_ptr, &intent))
		png_set_gamma(png_ptr, screen_gamma, 0.45455);
	else {
		double image_gamma;
		if (png_get_gAMA(png_ptr, info_ptr, &image_gamma))
			png_set_gamma(png_ptr, screen_gamma, image_gamma);
		else
			png_set_gamma(png_ptr, screen_gamma, 0.45455);
	}

	// Update the changes in between, as we need to get the new color type
	// for proper processing of the RGBA type
	png_read_update_info(png_ptr, info_ptr);
	{
		// Use temporary variables to avoid passing cast pointers
		png_uint_32 w, h;
		// Extract info
		png_get_IHDR(png_ptr, info_ptr,
				&w, &h,
				&BitDepth, &ColorType, NULL, NULL, NULL);
		Width = w;
		Height = h;
	}

	// Convert RGBA to BGRA
	if (ColorType == PNG_COLOR_TYPE_RGB_ALPHA) {
#ifdef __BIG_ENDIAN__
		png_set_swap_alpha(png_ptr);
#else
		png_set_bgr(png_ptr);
#endif
	}

	// Create the image structure to be filled by png data
	video::IImage *image = 0;
	if (ColorType == PNG_COLOR_TYPE_RGB_ALPHA)
		image = new CImage(ECF_A8R8G8B8, core::dimension2d<u32>(Width, Height));
	else
		image = new CImage(ECF_R8G8B8, core::dimension2d<u32>(Width, Height));
	if (!image) {
		os::Printer::log("LOAD PNG: Internal PNG create image struct failure", file->getFileName(), ELL_ERROR);
		png_destroy_read_struct(&png_ptr, NULL, NULL);
		return 0;
	}

	// Create array of pointers to rows in image data
	RowPointers = new png_bytep[Height];
	if (!RowPointers) {
		os::Printer::log("LOAD PNG: Internal PNG create row pointers failure", file->getFileName(), ELL_ERROR);
		png_destroy_read_struct(&png_ptr, NULL, NULL);
		delete image;
		return 0;
	}

	// Fill array of pointers to rows in image data
	unsigned char *data = (unsigned char *)image->getData();
	for (u32 i = 0; i < Height; ++i) {
		RowPointers[i] = data;
		data += image->getPitch();
	}

	// for proper error handling
	if (setjmp(png_jmpbuf(png_ptr))) {
		png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
		delete[] RowPointers;
		delete image;
		return 0;
	}

	// Read data using the library function that handles all transformations including interlacing
	png_read_image(png_ptr, RowPointers);

	png_read_end(png_ptr, NULL);
	delete[] RowPointers;
	png_destroy_read_struct(&png_ptr, &info_ptr, 0); // Clean up memory

	return image;
}